

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzbuildmultiphysicsmesh.cpp
# Opt level: O0

void TPZBuildMultiphysicsMesh::ComputeAtomicIndexes
               (TPZCompMesh *mesh,TPZVec<std::pair<TPZCompMesh_*,_long>_> *indexes)

{
  long *in_RSI;
  TPZCompEl *cel;
  int64_t el;
  atomic_index def;
  int64_t nel;
  int64_t ncon;
  int64_t in_stack_ffffffffffffffa8;
  TPZCompMesh *in_stack_ffffffffffffffb0;
  long local_48;
  int local_3c;
  TPZCompMesh *local_38;
  pair<TPZCompMesh_*,_long> local_30;
  int64_t local_20;
  int64_t local_18;
  long *local_10;
  
  local_10 = in_RSI;
  local_18 = TPZCompMesh::NConnects((TPZCompMesh *)0x1e41828);
  local_20 = TPZCompMesh::NElements((TPZCompMesh *)0x1e41837);
  local_38 = (TPZCompMesh *)0x0;
  local_3c = -1;
  std::pair<TPZCompMesh_*,_long>::pair<int,_true>(&local_30,&local_38,&local_3c);
  (**(code **)(*local_10 + 0x10))(local_10,local_18,&local_30);
  for (local_48 = 0; local_48 < local_20; local_48 = local_48 + 1) {
    in_stack_ffffffffffffffb0 =
         (TPZCompMesh *)TPZCompMesh::Element(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    if (in_stack_ffffffffffffffb0 != (TPZCompMesh *)0x0) {
      FillAtomic((TPZCompEl *)el,(TPZVec<std::pair<TPZCompMesh_*,_long>_> *)cel);
    }
  }
  return;
}

Assistant:

void TPZBuildMultiphysicsMesh::ComputeAtomicIndexes(TPZCompMesh *mesh, TPZVec<atomic_index> &indexes)
{
    int64_t ncon = mesh->NConnects();
    int64_t nel = mesh->NElements();
    atomic_index def(0,-1);
    indexes.Resize(ncon, def);
    for (int64_t el = 0; el<nel; el++) {
        TPZCompEl *cel = mesh->Element(el);
        if(cel)
        {
            FillAtomic(cel, indexes);
        }
    }
#ifdef PZDEBUG
    {
        int notfound = 0;
        for (int64_t i=0; i<indexes.size(); i++) {
            if(mesh->ConnectVec()[i].SequenceNumber() < 0) continue;
            if(indexes[i].first == 0) notfound++;
        }
        if(notfound)
        {
            std::cout << __PRETTY_FUNCTION__ << " number of missing connects " << notfound << std::endl;
        }
    }
#endif
}